

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall capnp::Capability::Client::whenResolved(Client *this)

{
  ClientHook *pCVar1;
  Own<capnp::ClientHook,_std::nullptr_t> *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> local_30;
  ClientHook local_20;
  Client *this_local;
  
  this_local = this;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(in_RSI);
  ClientHook::whenResolved(&local_20);
  pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(in_RSI);
  (*pCVar1->_vptr_ClientHook[4])(&local_30);
  kj::Promise<void>::attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<capnp::ClientHook,_std::nullptr_t> *)&local_20);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_30);
  kj::Promise<void>::~Promise((Promise<void> *)&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> Capability::Client::whenResolved() {
  return hook->whenResolved().attach(hook->addRef());
}